

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

bool __thiscall QIODevice::atEnd(QIODevice *this)

{
  QObjectData *pQVar1;
  QBindingStorageData *pQVar2;
  int iVar3;
  undefined4 extraout_var;
  QDynamicMetaObjectData *pQVar4;
  bool bVar5;
  
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (*(int *)&pQVar1[4].bindingStorage.d == 0) {
    return true;
  }
  pQVar2 = pQVar1[1].bindingStorage.d;
  if ((pQVar2 == (QBindingStorageData *)0x0) || (pQVar2[1].used == 0)) {
LAB_00244e2f:
    iVar3 = (*(this->super_QObject)._vptr_QObject[0x14])(this);
    bVar5 = CONCAT44(extraout_var,iVar3) == 0;
  }
  else {
    if (*(char *)((long)&pQVar1[4].bindingStorage.d + 4) == '\x01') {
      if (*(char *)((long)&pQVar1[4].bindingStorage.d + 6) == '\0') {
        iVar3 = (*pQVar1->q_ptr->_vptr_QObject[0xc])();
        *(char *)((long)&pQVar1[4].bindingStorage.d + 6) = '\x02' - (char)iVar3;
      }
      if (*(char *)((long)&pQVar1[4].bindingStorage.d + 6) == '\x01') {
        pQVar2 = pQVar1[1].bindingStorage.d;
        if (pQVar2 == (QBindingStorageData *)0x0) {
          pQVar4 = (QDynamicMetaObjectData *)0x0;
        }
        else {
          pQVar4 = (QDynamicMetaObjectData *)pQVar2[1].used;
        }
        if (pQVar1[1].metaObject == pQVar4) goto LAB_00244e2f;
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }